

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_objects.hh
# Opt level: O0

void __thiscall
tchecker::
intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>::
reset(intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>
      *this,make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL> *t)

{
  make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL> *t_local;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>
  *this_local;
  
  if (t != (make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL> *)0x0) {
    make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>::take_reference(t);
  }
  if (this->_t != (make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL> *)0x0) {
    make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>::release_reference(this->_t);
  }
  this->_t = t;
  return;
}

Assistant:

inline void reset(T * t = nullptr)
  {
    if (t != nullptr)
      t->take_reference();
    if (_t != nullptr)
      _t->release_reference();
    _t = t;
  }